

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_tostring(HSQUIRRELVM v,SQInteger idx)

{
  bool bVar1;
  SQObjectPtr *unaff_retaddr;
  SQVM *in_stack_00000008;
  SQObjectPtr res;
  SQObjectPtr *o;
  SQObjectPtr *in_stack_ffffffffffffffa8;
  HSQUIRRELVM in_stack_ffffffffffffffb0;
  SQVM *this;
  SQWeakRef *local_20;
  SQSharedState *in_stack_fffffffffffffff8;
  SQSharedState *pSVar2;
  
  local_20 = (SQWeakRef *)stack_get(in_stack_ffffffffffffffb0,(SQInteger)in_stack_ffffffffffffffa8);
  this = (SQVM *)&stack0xffffffffffffffd0;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)this);
  bVar1 = SQVM::ToString(in_stack_00000008,unaff_retaddr,(SQObjectPtr *)in_stack_fffffffffffffff8);
  if (bVar1) {
    SQVM::Push(this,in_stack_ffffffffffffffa8);
    pSVar2 = (SQSharedState *)0x0;
  }
  else {
    pSVar2 = (SQSharedState *)0xffffffffffffffff;
  }
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  return (SQRESULT)pSVar2;
}

Assistant:

SQRESULT sq_tostring(HSQUIRRELVM v,SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    SQObjectPtr res;
    if(!v->ToString(o,res)) {
        return SQ_ERROR;
    }
    v->Push(res);
    return SQ_OK;
}